

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surfscatter.cpp
# Opt level: O0

void __thiscall
pbrt::WavefrontPathIntegrator::EvaluateMaterialAndBSDF<pbrt::ThinDielectricMaterial>
          (WavefrontPathIntegrator *this,int wavefrontDepth,Transform movingFromCamera)

{
  Transform movingFromCamera_00;
  Transform movingFromCamera_01;
  uint uVar1;
  bool *pbVar2;
  long in_RDI;
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  int index;
  undefined1 local_110 [64];
  undefined1 local_d0 [20];
  int in_stack_ffffffffffffff44;
  MaterialEvalQueue *in_stack_ffffffffffffff48;
  WavefrontPathIntegrator *in_stack_ffffffffffffff50;
  undefined8 uStack_a8;
  undefined1 in_stack_ffffffffffffff60 [16];
  undefined1 in_stack_ffffffffffffff70 [64];
  undefined1 in_stack_ffffffffffffffb0 [48];
  undefined1 auStack_20 [16];
  
  uVar1 = TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
          ::TypeIndex<pbrt::ThinDielectricMaterial>();
  pbVar2 = pstd::array<bool,_12>::operator[]((array<bool,_12> *)(in_RDI + 3),(long)(int)uVar1);
  if ((*pbVar2 & 1U) != 0) {
    memcpy(&stack0xffffffffffffff70,&stack0x00000008,0x80);
    auVar3 = vmovdqu64_avx512f(in_stack_ffffffffffffff70);
    auVar4._48_16_ = auStack_20;
    auVar4._0_48_ = in_stack_ffffffffffffffb0;
    auVar4 = vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar4);
    vmovdqu64_avx512f(auVar3);
    movingFromCamera_00.m.m[1][0] = (Float)in_stack_ffffffffffffff70._0_4_;
    movingFromCamera_00.m.m[1][1] = (Float)in_stack_ffffffffffffff70._4_4_;
    movingFromCamera_00.m.m[1][2] = (Float)in_stack_ffffffffffffff70._8_4_;
    movingFromCamera_00.m.m[1][3] = (Float)in_stack_ffffffffffffff70._12_4_;
    movingFromCamera_00.m.m[2][0] = (Float)in_stack_ffffffffffffff70._16_4_;
    movingFromCamera_00.m.m[2][1] = (Float)in_stack_ffffffffffffff70._20_4_;
    movingFromCamera_00.m.m[2][2] = (Float)in_stack_ffffffffffffff70._24_4_;
    movingFromCamera_00.m.m[2][3] = (Float)in_stack_ffffffffffffff70._28_4_;
    movingFromCamera_00.m.m[3][0] = (Float)in_stack_ffffffffffffff70._32_4_;
    movingFromCamera_00.m.m[3][1] = (Float)in_stack_ffffffffffffff70._36_4_;
    movingFromCamera_00.m.m[3][2] = (Float)in_stack_ffffffffffffff70._40_4_;
    movingFromCamera_00.m.m[3][3] = (Float)in_stack_ffffffffffffff70._44_4_;
    movingFromCamera_00.mInv.m[0][0] = (Float)in_stack_ffffffffffffff70._48_4_;
    movingFromCamera_00.mInv.m[0][1] = (Float)in_stack_ffffffffffffff70._52_4_;
    movingFromCamera_00.mInv.m[0][2] = (Float)in_stack_ffffffffffffff70._56_4_;
    movingFromCamera_00.mInv.m[0][3] = (Float)in_stack_ffffffffffffff70._60_4_;
    movingFromCamera_00.m.m[0][0] = (Float)in_stack_ffffffffffffff60._0_4_;
    movingFromCamera_00.m.m[0][1] = (Float)in_stack_ffffffffffffff60._4_4_;
    movingFromCamera_00.m.m[0][2] = (Float)in_stack_ffffffffffffff60._8_4_;
    movingFromCamera_00.m.m[0][3] = (Float)in_stack_ffffffffffffff60._12_4_;
    movingFromCamera_00.mInv.m[1][0] = (Float)in_stack_ffffffffffffffb0._0_4_;
    movingFromCamera_00.mInv.m[1][1] = (Float)in_stack_ffffffffffffffb0._4_4_;
    movingFromCamera_00.mInv.m[1][2] = (Float)in_stack_ffffffffffffffb0._8_4_;
    movingFromCamera_00.mInv.m[1][3] = (Float)in_stack_ffffffffffffffb0._12_4_;
    movingFromCamera_00.mInv.m[2][0] = (Float)in_stack_ffffffffffffffb0._16_4_;
    movingFromCamera_00.mInv.m[2][1] = (Float)in_stack_ffffffffffffffb0._20_4_;
    movingFromCamera_00.mInv.m[2][2] = (Float)in_stack_ffffffffffffffb0._24_4_;
    movingFromCamera_00.mInv.m[2][3] = (Float)in_stack_ffffffffffffffb0._28_4_;
    movingFromCamera_00.mInv.m[3][0] = (Float)in_stack_ffffffffffffffb0._32_4_;
    movingFromCamera_00.mInv.m[3][1] = (Float)in_stack_ffffffffffffffb0._36_4_;
    movingFromCamera_00.mInv.m[3][2] = (Float)in_stack_ffffffffffffffb0._40_4_;
    movingFromCamera_00.mInv.m[3][3] = (Float)in_stack_ffffffffffffffb0._44_4_;
    EvaluateMaterialAndBSDF<pbrt::ThinDielectricMaterial,pbrt::BasicTextureEvaluator>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,movingFromCamera_00,
               in_stack_ffffffffffffff44);
  }
  pbVar2 = pstd::array<bool,_12>::operator[]((array<bool,_12> *)(in_RDI + 0xf),(long)(int)uVar1);
  if ((*pbVar2 & 1U) != 0) {
    memcpy(local_110,&stack0x00000008,0x80);
    auVar4 = vmovdqu64_avx512f(local_110);
    auVar3._20_4_ = in_stack_ffffffffffffff44;
    auVar3._0_20_ = local_d0;
    auVar3._24_8_ = in_stack_ffffffffffffff48;
    auVar3._32_8_ = in_stack_ffffffffffffff50;
    auVar3._40_8_ = uStack_a8;
    auVar3._48_16_ = in_stack_ffffffffffffff60;
    auVar3 = vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar3);
    vmovdqu64_avx512f(auVar4);
    movingFromCamera_01.m.m[1][0] = (Float)in_stack_ffffffffffffff70._0_4_;
    movingFromCamera_01.m.m[1][1] = (Float)in_stack_ffffffffffffff70._4_4_;
    movingFromCamera_01.m.m[1][2] = (Float)in_stack_ffffffffffffff70._8_4_;
    movingFromCamera_01.m.m[1][3] = (Float)in_stack_ffffffffffffff70._12_4_;
    movingFromCamera_01.m.m[2][0] = (Float)in_stack_ffffffffffffff70._16_4_;
    movingFromCamera_01.m.m[2][1] = (Float)in_stack_ffffffffffffff70._20_4_;
    movingFromCamera_01.m.m[2][2] = (Float)in_stack_ffffffffffffff70._24_4_;
    movingFromCamera_01.m.m[2][3] = (Float)in_stack_ffffffffffffff70._28_4_;
    movingFromCamera_01.m.m[3][0] = (Float)in_stack_ffffffffffffff70._32_4_;
    movingFromCamera_01.m.m[3][1] = (Float)in_stack_ffffffffffffff70._36_4_;
    movingFromCamera_01.m.m[3][2] = (Float)in_stack_ffffffffffffff70._40_4_;
    movingFromCamera_01.m.m[3][3] = (Float)in_stack_ffffffffffffff70._44_4_;
    movingFromCamera_01.mInv.m[0][0] = (Float)in_stack_ffffffffffffff70._48_4_;
    movingFromCamera_01.mInv.m[0][1] = (Float)in_stack_ffffffffffffff70._52_4_;
    movingFromCamera_01.mInv.m[0][2] = (Float)in_stack_ffffffffffffff70._56_4_;
    movingFromCamera_01.mInv.m[0][3] = (Float)in_stack_ffffffffffffff70._60_4_;
    movingFromCamera_01.m.m[0][0] = (Float)in_stack_ffffffffffffff60._0_4_;
    movingFromCamera_01.m.m[0][1] = (Float)in_stack_ffffffffffffff60._4_4_;
    movingFromCamera_01.m.m[0][2] = (Float)in_stack_ffffffffffffff60._8_4_;
    movingFromCamera_01.m.m[0][3] = (Float)in_stack_ffffffffffffff60._12_4_;
    movingFromCamera_01.mInv.m[1][0] = (Float)in_stack_ffffffffffffffb0._0_4_;
    movingFromCamera_01.mInv.m[1][1] = (Float)in_stack_ffffffffffffffb0._4_4_;
    movingFromCamera_01.mInv.m[1][2] = (Float)in_stack_ffffffffffffffb0._8_4_;
    movingFromCamera_01.mInv.m[1][3] = (Float)in_stack_ffffffffffffffb0._12_4_;
    movingFromCamera_01.mInv.m[2][0] = (Float)in_stack_ffffffffffffffb0._16_4_;
    movingFromCamera_01.mInv.m[2][1] = (Float)in_stack_ffffffffffffffb0._20_4_;
    movingFromCamera_01.mInv.m[2][2] = (Float)in_stack_ffffffffffffffb0._24_4_;
    movingFromCamera_01.mInv.m[2][3] = (Float)in_stack_ffffffffffffffb0._28_4_;
    movingFromCamera_01.mInv.m[3][0] = (Float)in_stack_ffffffffffffffb0._32_4_;
    movingFromCamera_01.mInv.m[3][1] = (Float)in_stack_ffffffffffffffb0._36_4_;
    movingFromCamera_01.mInv.m[3][2] = (Float)in_stack_ffffffffffffffb0._40_4_;
    movingFromCamera_01.mInv.m[3][3] = (Float)in_stack_ffffffffffffffb0._44_4_;
    EvaluateMaterialAndBSDF<pbrt::ThinDielectricMaterial,pbrt::UniversalTextureEvaluator>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,movingFromCamera_01,
               in_stack_ffffffffffffff44);
  }
  return;
}

Assistant:

void WavefrontPathIntegrator::EvaluateMaterialAndBSDF(int wavefrontDepth,
                                                      Transform movingFromCamera) {
    int index = Material::TypeIndex<ConcreteMaterial>();
    if (haveBasicEvalMaterial[index])
        EvaluateMaterialAndBSDF<ConcreteMaterial, BasicTextureEvaluator>(
            basicEvalMaterialQueue, movingFromCamera, wavefrontDepth);
    if (haveUniversalEvalMaterial[index])
        EvaluateMaterialAndBSDF<ConcreteMaterial, UniversalTextureEvaluator>(
            universalEvalMaterialQueue, movingFromCamera, wavefrontDepth);
}